

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baggage_types.cpp
# Opt level: O3

void __thiscall
jaegertracing::thrift::BaggageRestriction::printTo(BaggageRestriction *this,ostream *out)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"BaggageRestriction(",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(out,"baggageKey=",0xb);
  apache::thrift::to_string<std::__cxx11::string>(&local_40,(thrift *)&this->baggageKey,t);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"maxValueLength=",0xf);
  apache::thrift::to_string<int>(&local_40,&this->maxValueLength);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void BaggageRestriction::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "BaggageRestriction(";
  out << "baggageKey=" << to_string(baggageKey);
  out << ", " << "maxValueLength=" << to_string(maxValueLength);
  out << ")";
}